

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::ted_init
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2)

{
  double dVar1;
  int iVar2;
  UnitCostModelLD<label::StringLabel> *pUVar3;
  int *piVar4;
  const_reference pvVar5;
  double *pdVar6;
  const_reference pvVar7;
  double dVar8;
  int local_34;
  int local_30;
  int y;
  int x;
  int size_y;
  int size_x;
  int max_size;
  TreeIndexAPTED *t2_local;
  TreeIndexAPTED *t1_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  
  (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>).
  subproblem_counter_ = 0;
  piVar4 = std::max<int>((int *)t1,(int *)t2);
  iVar2 = *piVar4;
  std::vector<double,_std::allocator<double>_>::resize(&this->q_,(long)(iVar2 + 1));
  std::vector<int,_std::allocator<int>_>::resize(&this->fn_,(long)(iVar2 + 2));
  std::vector<int,_std::allocator<int>_>::resize(&this->ft_,(long)(iVar2 + 2));
  for (local_30 = 0; local_30 < (t1->super_Constants).tree_size_; local_30 = local_30 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(t1->super_PreLToSize).prel_to_size_,(long)local_30);
    iVar2 = *pvVar5;
    for (local_34 = 0; local_34 < (t2->super_Constants).tree_size_; local_34 = local_34 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2->super_PreLToSize).prel_to_size_,(long)local_34);
      if ((iVar2 == 1) && (*pvVar5 == 1)) {
        pdVar6 = data_structures::Matrix<double>::at(&this->delta_,(long)local_30,(long)local_34);
        *pdVar6 = 0.0;
      }
      else if (iVar2 == 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(t2->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_,(long)local_34)
        ;
        dVar1 = *pvVar7;
        pUVar3 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PreLToLabelId).prel_to_label_id_,(long)local_34);
        dVar8 = cost_model::UnitCostModelLD<label::StringLabel>::ins(pUVar3,*pvVar5);
        pdVar6 = data_structures::Matrix<double>::at(&this->delta_,(long)local_30,(long)local_34);
        *pdVar6 = dVar1 - dVar8;
      }
      else if (*pvVar5 == 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(t1->super_PreLToSubtreeCost).prel_to_subtree_del_cost_,(long)local_30)
        ;
        dVar1 = *pvVar7;
        pUVar3 = (this->
                 super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                 ).c_;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t1->super_PreLToLabelId).prel_to_label_id_,(long)local_30);
        dVar8 = cost_model::UnitCostModelLD<label::StringLabel>::del(pUVar3,*pvVar5);
        pdVar6 = data_structures::Matrix<double>::at(&this->delta_,(long)local_30,(long)local_34);
        *pdVar6 = dVar1 - dVar8;
      }
    }
  }
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::ted_init(const TreeIndex& t1, const TreeIndex& t2) {
  // Reset the subproblems counter.
  subproblem_counter_ = 0;
  // Initialize arrays.
  int max_size = std::max(t1.tree_size_, t2.tree_size_) + 1;
  // TODO: Move q initialisation to spfA.
  q_.resize(max_size);
  // TODO: Do not use fn and ft arrays [1, Section 8.4].
  fn_.resize(max_size + 1);
  ft_.resize(max_size + 1);
  // Compute subtree distances without the root nodes when one of subtrees
  // is a single node.
  int size_x = -1;
  int size_y = -1;
  // int parent_x = -1;
  // int parent_y = -1;
  // Loop over the nodes in reversed left-to-right preorder.
  for(int x = 0; x < t1.tree_size_; ++x) {
    size_x = t1.prel_to_size_[x];
    // parent_x = ni_1.preL_to_parent_[x];
    for(int y = 0; y < t2.tree_size_; ++y) {
      size_y = t2.prel_to_size_[y];
      // parent_y = ni_2.preL_to_parent_[y];
      // Set values in delta based on the sums of deletion and insertion
      // costs. Substract the costs for root nodes.
      // In this method we don't have to verify the order of the input trees
      // because it is equal to the original.
      if (size_x == 1 && size_y == 1) {
        delta_.at(x, y) = 0.0;
      } else if (size_x == 1) {
        delta_.at(x, y) = t2.prel_to_subtree_ins_cost_[y] - c_.ins(t2.prel_to_label_id_[y]);
      } else if (size_y == 1) {
        delta_.at(x, y) = t1.prel_to_subtree_del_cost_[x] - c_.del(t1.prel_to_label_id_[x]);
      }
    }
  }
}